

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O2

void av1_quantize_lp_c(int16_t *coeff_ptr,intptr_t n_coeffs,int16_t *round_ptr,int16_t *quant_ptr,
                      int16_t *qcoeff_ptr,int16_t *dqcoeff_ptr,int16_t *dequant_ptr,
                      uint16_t *eob_ptr,int16_t *scan,int16_t *iscan)

{
  ushort uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ushort uVar5;
  short sVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar9 = 0;
  memset(qcoeff_ptr,0,n_coeffs * 2);
  memset(dqcoeff_ptr,0,n_coeffs * 2);
  if (n_coeffs < 1) {
    n_coeffs = uVar9;
  }
  uVar2 = 0xffffffffffffffff;
  for (; n_coeffs != uVar9; uVar9 = uVar9 + 1) {
    lVar3 = (long)scan[uVar9];
    uVar1 = coeff_ptr[lVar3];
    uVar5 = (short)uVar1 >> 0xf;
    uVar4 = (ulong)((uint)(lVar3 != 0) * 2);
    iVar7 = (int)*(short *)((long)round_ptr + uVar4) + (uint)(uVar1 >> 0xf) +
            (int)(short)(uVar5 ^ uVar1);
    if (0x7ffe < iVar7) {
      iVar7 = 0x7fff;
    }
    if (iVar7 < -0x7fff) {
      iVar7 = -0x8000;
    }
    uVar8 = *(short *)((long)quant_ptr + uVar4) * iVar7;
    sVar6 = ((ushort)(uVar8 >> 0x10) ^ uVar5) - uVar5;
    qcoeff_ptr[lVar3] = sVar6;
    dqcoeff_ptr[lVar3] = sVar6 * *(short *)((long)dequant_ptr + uVar4);
    if (0xffff < uVar8) {
      uVar2 = uVar9 & 0xffffffff;
    }
  }
  *eob_ptr = (short)uVar2 + 1;
  return;
}

Assistant:

void av1_quantize_lp_c(const int16_t *coeff_ptr, intptr_t n_coeffs,
                       const int16_t *round_ptr, const int16_t *quant_ptr,
                       int16_t *qcoeff_ptr, int16_t *dqcoeff_ptr,
                       const int16_t *dequant_ptr, uint16_t *eob_ptr,
                       const int16_t *scan, const int16_t *iscan) {
  (void)iscan;
  int eob = -1;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  // Quantization pass: All coefficients with index >= zero_flag are
  // skippable. Note: zero_flag can be zero.
  for (int i = 0; i < n_coeffs; i++) {
    const int rc = scan[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;

    int tmp = clamp(abs_coeff + round_ptr[rc != 0], INT16_MIN, INT16_MAX);
    tmp = (tmp * quant_ptr[rc != 0]) >> 16;

    qcoeff_ptr[rc] = (tmp ^ coeff_sign) - coeff_sign;
    dqcoeff_ptr[rc] = qcoeff_ptr[rc] * dequant_ptr[rc != 0];

    if (tmp) eob = i;
  }
  *eob_ptr = eob + 1;
}